

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkCallFromRoot(CheckerVisitor *this,CallExpr *call)

{
  undefined8 *puVar1;
  int iVar2;
  SQChar *__s1;
  pointer pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *candidate;
  undefined8 *puVar4;
  const_iterator __end1;
  
  if ((this->effectsOnly == false) &&
     (__s1 = extractFunctionName(this,call), puVar1 = DAT_001a8100,
     puVar4 = SQCompilationContext::function_must_be_called_from_root_abi_cxx11_,
     __s1 != (SQChar *)0x0)) {
    for (; puVar4 != puVar1; puVar4 = puVar4 + 4) {
      iVar2 = strcmp(__s1,(char *)*puVar4);
      if (iVar2 == 0) {
        pSVar3 = (this->nodeStack).
                 super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          if (pSVar3 == (this->nodeStack).
                        super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            return;
          }
          if ((pSVar3[-1].sst != SST_TABLE_MEMBER) &&
             ((pSVar3[-1].field_1.n)->_op - TO_FUNCTION < 3)) break;
          pSVar3 = pSVar3 + -1;
        }
        report(this,(Node *)call,0x83,__s1);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallFromRoot(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *fn = extractFunctionName(call);

  if (!fn)
    return;

  if (!nameLooksLikeMustBeCalledFromRoot(fn)) {
    return;
  }

  bool do_report = false;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst == SST_TABLE_MEMBER)
      continue;

    enum TreeOp op = it->n->op();

    if (op == TO_FUNCTION || op == TO_CLASS || op == TO_CONSTRUCTOR) {
      do_report = true;
      break;
    }
  }

  if (do_report) {
    report(call, DiagnosticsId::DI_CALL_FROM_ROOT, fn);
  }
}